

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O1

int lws_rx_flow_control(lws *wsi,int _enable)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  
  if (((wsi->role_ops != &role_ops_h2) && ((wsi->field_0x2dc & 2) == 0)) &&
     ((wsi->wsistate & 0xf000000) != 0x1000000)) {
    _lws_log(8,"%s: %p 0x%x\n","lws_rx_flow_control",wsi,(ulong)(uint)_enable);
    uVar3 = (ulong)((_enable & 1U) << 0xd | 0x4001);
    if (((uint)_enable >> 0xe & 1) != 0) {
      uVar3 = (ulong)(uint)_enable;
    }
    bVar1 = ~(byte)uVar3 & wsi->rxflow_bitmap;
    if (((uint)uVar3 >> 0xd & 1) == 0) {
      bVar1 = wsi->rxflow_bitmap | (byte)uVar3;
    }
    wsi->rxflow_bitmap = bVar1;
    uVar4 = (bVar1 == 0) + 2;
    if (uVar4 != ((uint)(*(ulong *)&wsi->field_0x2dc >> 0xd) & 3)) {
      *(ulong *)&wsi->field_0x2dc =
           *(ulong *)&wsi->field_0x2dc & 0xffffffffffff9fff | (ulong)(uVar4 * 0x2000);
      _lws_log(8,"%s: %p: bitmap 0x%x: en 0x%x, ch 0x%x\n","lws_rx_flow_control",wsi,(ulong)bVar1,
               uVar3,uVar4);
      if ((((uint)_enable >> 0xc & 1) != 0) || ((wsi->field_0x2df & 0x80) == 0)) {
        iVar2 = __lws_rx_flow_control(wsi);
        return iVar2;
      }
    }
  }
  return 0;
}

Assistant:

int
lws_rx_flow_control(struct lws *wsi, int _enable)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	int en = _enable;

	// h2 ignores rx flow control atm
	if (lwsi_role_h2(wsi) || wsi->mux_substream ||
	    lwsi_role_h2_ENCAPSULATION(wsi))
		return 0; // !!!

	lwsl_info("%s: %p 0x%x\n", __func__, wsi, _enable);

	if (!(_enable & LWS_RXFLOW_REASON_APPLIES)) {
		/*
		 * convert user bool style to bitmap style... in user simple
		 * bool style _enable = 0 = flow control it, = 1 = allow rx
		 */
		en = LWS_RXFLOW_REASON_APPLIES | LWS_RXFLOW_REASON_USER_BOOL;
		if (_enable & 1)
			en |= LWS_RXFLOW_REASON_APPLIES_ENABLE_BIT;
	}

	lws_pt_lock(pt, __func__);

	/* any bit set in rxflow_bitmap DISABLEs rxflow control */
	if (en & LWS_RXFLOW_REASON_APPLIES_ENABLE_BIT)
		wsi->rxflow_bitmap &= ~(en & 0xff);
	else
		wsi->rxflow_bitmap |= en & 0xff;

	if ((LWS_RXFLOW_PENDING_CHANGE | (!wsi->rxflow_bitmap)) ==
	    wsi->rxflow_change_to)
		goto skip;

	wsi->rxflow_change_to = LWS_RXFLOW_PENDING_CHANGE |
				(!wsi->rxflow_bitmap);

	lwsl_info("%s: %p: bitmap 0x%x: en 0x%x, ch 0x%x\n", __func__, wsi,
		  wsi->rxflow_bitmap, en, wsi->rxflow_change_to);

	if (_enable & LWS_RXFLOW_REASON_FLAG_PROCESS_NOW ||
	    !wsi->rxflow_will_be_applied) {
		en = __lws_rx_flow_control(wsi);
		lws_pt_unlock(pt);

		return en;
	}

skip:
	lws_pt_unlock(pt);

	return 0;
}